

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O2

void bigval_import_le(bigval *r,void *vdata,int len)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  bigval_clear(r);
  uVar2 = 0;
  uVar3 = (ulong)(uint)len;
  if (len < 1) {
    uVar3 = uVar2;
  }
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    puVar1 = (ulong *)((long)r->w + (ulong)((uint)uVar2 & 0xfffffff8));
    *puVar1 = *puVar1 | (ulong)*(byte *)((long)vdata + uVar2) << ((char)uVar2 * '\b' & 0x3fU);
  }
  return;
}

Assistant:

static void bigval_import_le(bigval *r, const void *vdata, int len)
{
    const unsigned char *data = (const unsigned char *)vdata;
    int i;
    bigval_clear(r);
    for (i = 0; i < len; i++)
        r->w[i / BIGNUM_INT_BYTES] |=
            (BignumInt)data[i] << (8 * (i % BIGNUM_INT_BYTES));
}